

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

DecompressResult
tcu::astc::anon_unknown_0::decodeVoidExtentBlock
          (void *dst,Block128 *blockData,int blockWidth,int blockHeight,bool isSRGB,bool isLDRMode)

{
  bool bVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  InternalError *this;
  bool bVar6;
  float fVar7;
  float local_f4;
  int local_c0;
  int local_bc;
  int c_3;
  int i_2;
  int c_2;
  int i_1;
  allocator<char> local_99;
  string local_98;
  int local_74;
  void *pvStack_70;
  int c_1;
  float *dstF;
  int c;
  int i;
  deUint8 *dstU;
  deUint32 rgba [4];
  bool isHDRBlock;
  bool allExtentsAllOnes;
  deUint32 maxTExtent;
  deUint32 minTExtent;
  deUint32 maxSExtent;
  deUint32 minSExtent;
  bool isLDRMode_local;
  bool isSRGB_local;
  int blockHeight_local;
  int blockWidth_local;
  Block128 *blockData_local;
  void *dst_local;
  
  dVar2 = Block128::getBits(blockData,0xc,0x18);
  dVar3 = Block128::getBits(blockData,0x19,0x25);
  dVar4 = Block128::getBits(blockData,0x26,0x32);
  dVar5 = Block128::getBits(blockData,0x33,0x3f);
  bVar6 = false;
  if (((dVar2 == 0x1fff) && (bVar6 = false, dVar3 == 0x1fff)) && (bVar6 = false, dVar4 == 0x1fff)) {
    bVar6 = dVar5 == 0x1fff;
  }
  bVar1 = Block128::isBitSet(blockData,9);
  if (((isLDRMode) && (bVar1)) || ((!bVar6 && ((dVar3 <= dVar2 || (dVar5 <= dVar4)))))) {
    setASTCErrorColorBlock(dst,blockWidth,blockHeight,isSRGB);
    dst_local._4_4_ = DECOMPRESS_RESULT_ERROR;
  }
  else {
    dstU._0_4_ = Block128::getBits(blockData,0x40,0x4f);
    dstU._4_4_ = Block128::getBits(blockData,0x50,0x5f);
    rgba[0] = Block128::getBits(blockData,0x60,0x6f);
    rgba[1] = Block128::getBits(blockData,0x70,0x7f);
    if (isSRGB) {
      for (dstF._4_4_ = 0; dstF._4_4_ < blockWidth * blockHeight; dstF._4_4_ = dstF._4_4_ + 1) {
        for (dstF._0_4_ = 0; (int)dstF < 4; dstF._0_4_ = (int)dstF + 1) {
          *(char *)((long)dst + (long)(dstF._4_4_ * 4 + (int)dstF)) =
               (char)(rgba[(long)(int)dstF + -2] >> 8);
        }
      }
    }
    else if (bVar1) {
      pvStack_70 = dst;
      for (local_74 = 0; local_74 < 4; local_74 = local_74 + 1) {
        bVar6 = isFloat16InfOrNan((deFloat16)rgba[(long)local_74 + -2]);
        if (bVar6) {
          this = (InternalError *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,
                     "Infinity or NaN color component in HDR void extent block in ASTC texture (behavior undefined by ASTC specification)"
                     ,&local_99);
          InternalError::InternalError(this,&local_98);
          __cxa_throw(this,&InternalError::typeinfo,InternalError::~InternalError);
        }
      }
      for (i_2 = 0; i_2 < blockWidth * blockHeight; i_2 = i_2 + 1) {
        for (c_3 = 0; c_3 < 4; c_3 = c_3 + 1) {
          fVar7 = deFloat16To32((deFloat16)rgba[(long)c_3 + -2]);
          *(float *)((long)pvStack_70 + (long)(i_2 * 4 + c_3) * 4) = fVar7;
        }
      }
    }
    else {
      for (local_bc = 0; local_bc < blockWidth * blockHeight; local_bc = local_bc + 1) {
        for (local_c0 = 0; local_c0 < 4; local_c0 = local_c0 + 1) {
          if (rgba[(long)local_c0 + -2] == 0xffff) {
            local_f4 = 1.0;
          }
          else {
            local_f4 = (float)rgba[(long)local_c0 + -2] / 65536.0;
          }
          *(float *)((long)dst + (long)(local_bc * 4 + local_c0) * 4) = local_f4;
        }
      }
    }
    dst_local._4_4_ = DECOMPRESS_RESULT_VALID_BLOCK;
  }
  return dst_local._4_4_;
}

Assistant:

DecompressResult decodeVoidExtentBlock (void* dst, const Block128& blockData, int blockWidth, int blockHeight, bool isSRGB, bool isLDRMode)
{
	const deUint32	minSExtent			= blockData.getBits(12, 24);
	const deUint32	maxSExtent			= blockData.getBits(25, 37);
	const deUint32	minTExtent			= blockData.getBits(38, 50);
	const deUint32	maxTExtent			= blockData.getBits(51, 63);
	const bool		allExtentsAllOnes	= minSExtent == 0x1fff && maxSExtent == 0x1fff && minTExtent == 0x1fff && maxTExtent == 0x1fff;
	const bool		isHDRBlock			= blockData.isBitSet(9);

	if ((isLDRMode && isHDRBlock) || (!allExtentsAllOnes && (minSExtent >= maxSExtent || minTExtent >= maxTExtent)))
	{
		setASTCErrorColorBlock(dst, blockWidth, blockHeight, isSRGB);
		return DECOMPRESS_RESULT_ERROR;
	}

	const deUint32 rgba[4] =
	{
		blockData.getBits(64,  79),
		blockData.getBits(80,  95),
		blockData.getBits(96,  111),
		blockData.getBits(112, 127)
	};

	if (isSRGB)
	{
		deUint8* const dstU = (deUint8*)dst;
		for (int i = 0; i < blockWidth*blockHeight; i++)
		for (int c = 0; c < 4; c++)
			dstU[i*4 + c] = (deUint8)((rgba[c] & 0xff00) >> 8);
	}
	else
	{
		float* const dstF = (float*)dst;

		if (isHDRBlock)
		{
			for (int c = 0; c < 4; c++)
			{
				if (isFloat16InfOrNan((deFloat16)rgba[c]))
					throw InternalError("Infinity or NaN color component in HDR void extent block in ASTC texture (behavior undefined by ASTC specification)");
			}

			for (int i = 0; i < blockWidth*blockHeight; i++)
			for (int c = 0; c < 4; c++)
				dstF[i*4 + c] = deFloat16To32((deFloat16)rgba[c]);
		}
		else
		{
			for (int i = 0; i < blockWidth*blockHeight; i++)
			for (int c = 0; c < 4; c++)
				dstF[i*4 + c] = rgba[c] == 65535 ? 1.0f : (float)rgba[c] / 65536.0f;
		}
	}

	return DECOMPRESS_RESULT_VALID_BLOCK;
}